

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_conn.cc
# Opt level: O3

void __thiscall ConnDecl::ProcessFlowElement(ConnDecl *this,AnalyzerFlow *flow_elem)

{
  int iVar1;
  Exception *this_00;
  char *pcVar2;
  string sStack_38;
  
  iVar1 = *(int *)&(flow_elem->super_AnalyzerElement).field_0x54;
  if (this->flows_[iVar1 != 0] == (AnalyzerFlow *)0x0) {
    this->flows_[iVar1 != 0] = flow_elem;
    Type::AddField((this->super_AnalyzerDecl).super_TypeDecl.type_,
                   &flow_elem->flow_field_->super_Field);
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x20);
  pcVar2 = "up";
  if (iVar1 != 0) {
    pcVar2 = "down";
  }
  strfmt_abi_cxx11_(&sStack_38,"%sflow already defined",pcVar2);
  Exception::Exception(this_00,&(flow_elem->super_AnalyzerElement).super_Object,&sStack_38);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void ConnDecl::ProcessFlowElement(AnalyzerFlow* flow_elem)
	{
	int flow_index;

	if ( flow_elem->dir() == AnalyzerFlow::UP )
		flow_index = 0;
	else
		flow_index = 1;

	if ( flows_[flow_index] )
		{
		throw Exception(flow_elem,
		                strfmt("%sflow already defined", flow_index == 0 ? "up" : "down"));
		}

	flows_[flow_index] = flow_elem;
	type_->AddField(flow_elem->flow_field());
	}